

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int cmpforsearch(void *av,void *bv)

{
  int bs;
  int as;
  NetSocket *b;
  void *bv_local;
  void *av_local;
  
  if (*av < *(int *)((long)bv + 8)) {
    av_local._4_4_ = -1;
  }
  else if (*(int *)((long)bv + 8) < *av) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int cmpforsearch(void *av, void *bv)
{
    NetSocket *b = (NetSocket *) bv;
    int as = *(int *)av, bs = b->s;
    if (as < bs)
        return -1;
    if (as > bs)
        return +1;
    return 0;
}